

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall dg::vr::AllocatedArea::AllocatedArea(AllocatedArea *this,CallInst *call)

{
  AllocationFunction AVar1;
  Value *pVVar2;
  uint64_t size_00;
  undefined8 in_RSI;
  CallBase *in_RDI;
  AnalysisOptions *in_stack_00000020;
  ConstantInt *size;
  AnalysisOptions options;
  string *name;
  undefined8 in_stack_ffffffffffffff38;
  uint i_nocapture;
  CallBase *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  AnalysisOptions *in_stack_ffffffffffffff58;
  uint64_t local_a0;
  StringRef *in_stack_ffffffffffffff68;
  AllocatedSizeView local_90 [4];
  undefined1 local_48 [16];
  string local_38 [32];
  string *local_18;
  
  i_nocapture = (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  *(undefined8 *)in_RDI = in_RSI;
  *(undefined8 *)(in_RDI + 8) = 0;
  AllocatedSizeView::AllocatedSizeView((AllocatedSizeView *)(in_RDI + 0x10));
  llvm::CallBase::getCalledFunction(in_stack_ffffffffffffff48);
  local_48 = llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff68);
  local_18 = local_38;
  AnalysisOptions::AnalysisOptions(in_stack_00000020);
  AVar1 = AnalysisOptions::getAllocationFunction
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (AVar1 != ALLOCA) {
    AVar1 = AnalysisOptions::getAllocationFunction
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (AVar1 != MALLOC) goto LAB_001edd7a;
  }
  pVVar2 = llvm::CallBase::getOperand(in_RDI,i_nocapture);
  AllocatedSizeView::AllocatedSizeView(local_90,pVVar2,1);
  *(Value **)(in_RDI + 0x10) = local_90[0].elementCount;
  *(uint64_t *)(in_RDI + 0x18) = local_90[0].elementSize;
LAB_001edd7a:
  AVar1 = AnalysisOptions::getAllocationFunction
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (AVar1 == CALLOC) {
    llvm::CallBase::getOperand(in_RDI,i_nocapture);
    llvm::cast<llvm::ConstantInt,llvm::Value>((Value *)0x1eddab);
    pVVar2 = llvm::CallBase::getOperand(in_RDI,i_nocapture);
    size_00 = llvm::ConstantInt::getZExtValue((ConstantInt *)0x1eddcd);
    AllocatedSizeView::AllocatedSizeView
              ((AllocatedSizeView *)&stack0xffffffffffffff58,pVVar2,size_00);
    i_nocapture = (uint)((ulong)pVVar2 >> 0x20);
    *(AnalysisOptions **)(in_RDI + 0x10) = in_stack_ffffffffffffff58;
    *(uint64_t *)(in_RDI + 0x18) = local_a0;
  }
  AVar1 = AnalysisOptions::getAllocationFunction
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (AVar1 == REALLOC) {
    pVVar2 = llvm::CallBase::getOperand(in_RDI,i_nocapture);
    AllocatedSizeView::AllocatedSizeView((AllocatedSizeView *)&stack0xffffffffffffff48,pVVar2,1);
    *(CallBase **)(in_RDI + 0x10) = in_stack_ffffffffffffff48;
    *(string **)(in_RDI + 0x18) = in_stack_ffffffffffffff50;
    pVVar2 = llvm::CallBase::getOperand(in_RDI,i_nocapture);
    *(Value **)(in_RDI + 8) = pVVar2;
  }
  AnalysisOptions::~AnalysisOptions((AnalysisOptions *)0x1ede69);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

AllocatedArea::AllocatedArea(const llvm::CallInst *call) : ptr(call) {
    const std::string &name = call->getCalledFunction()->getName().str();
    AnalysisOptions options;

    if (options.getAllocationFunction(name) == AllocationFunction::ALLOCA ||
        options.getAllocationFunction(name) == AllocationFunction::MALLOC) {
        originalSizeView = AllocatedSizeView(call->getOperand(0), 1);
    }

    if (options.getAllocationFunction(name) == AllocationFunction::CALLOC) {
        const auto *size = llvm::cast<llvm::ConstantInt>(call->getOperand(1));
        originalSizeView =
                AllocatedSizeView(call->getOperand(0), size->getZExtValue());
    }

    if (options.getAllocationFunction(name) == AllocationFunction::REALLOC) {
        originalSizeView = AllocatedSizeView(call->getOperand(0), 1);
        reallocatedPtr = call->getOperand(0);
    }
}